

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int jsonEachColumn(sqlite3_vtab_cursor *cur,sqlite3_context *ctx,int iColumn)

{
  sqlite3_vtab *psVar1;
  u32 i_00;
  uint uVar2;
  u32 n_1;
  u64 nBase;
  u32 i_2;
  u8 eType;
  u32 i_1;
  u32 i;
  i64 x;
  u32 j;
  u32 n;
  JsonEachCursor *p;
  sqlite3_context *psStack_18;
  int iColumn_local;
  sqlite3_context *ctx_local;
  sqlite3_vtab_cursor *cur_local;
  
  _j = cur;
  p._4_4_ = iColumn;
  psStack_18 = ctx;
  ctx_local = (sqlite3_context *)cur;
  switch(iColumn) {
  case 0:
    if (*(int *)((long)&cur[3].pVtab + 4) == 0) {
      if (*(int *)((long)&cur[2].pVtab + 4) != 1) {
        x._0_4_ = jsonEachPathLength((JsonEachCursor *)cur);
        x._4_4_ = *(int *)((long)&_j[2].pVtab + 4) - (uint)x;
        if (x._4_4_ != 0) {
          if (*(char *)((long)&(_j[8].pVtab)->pModule + (ulong)(uint)x) == '[') {
            sqlite3Atoi64((char *)((long)&(_j[8].pVtab)->pModule + (ulong)((uint)x + 1)),(i64 *)&i_1
                          ,x._4_4_ + -1,'\x01');
            sqlite3_result_int64(psStack_18,_i_1);
          }
          else if (*(char *)((long)&(_j[8].pVtab)->pModule + (ulong)((uint)x + 1)) == '\"') {
            sqlite3_result_text(psStack_18,
                                (char *)((long)&(_j[8].pVtab)->pModule + (ulong)((uint)x + 2)),
                                x._4_4_ + -3,(_func_void_void_ptr *)0xffffffffffffffff);
          }
          else {
            sqlite3_result_text(psStack_18,
                                (char *)((long)&(_j[8].pVtab)->pModule + (ulong)((uint)x + 1)),
                                x._4_4_ + -1,(_func_void_void_ptr *)0xffffffffffffffff);
          }
        }
      }
    }
    else if (*(char *)&cur[3].pVtab == '\f') {
      jsonReturnFromBlob((JsonParse *)(cur + 0x18),*(u32 *)((long)&cur[1].pVtab + 4),ctx,1);
    }
    else {
      sqlite3_result_int64(ctx,(i64)cur[5].pVtab[*(int *)((long)&cur[3].pVtab + 4) - 1].zErrMsg);
    }
    break;
  case 1:
    i_00 = jsonSkipLabel((JsonEachCursor *)cur);
    jsonReturnFromBlob((JsonParse *)(_j + 0x18),i_00,psStack_18,1);
    if (10 < (*(byte *)((long)&(_j[0x18].pVtab)->pModule + (ulong)i_00) & 0xf)) {
      sqlite3_result_subtype(psStack_18,0x4a);
    }
    break;
  case 2:
    uVar2 = jsonSkipLabel((JsonEachCursor *)cur);
    sqlite3_result_text(psStack_18,
                        jsonbType[*(byte *)((long)&(_j[0x18].pVtab)->pModule + (ulong)uVar2) & 0xf],
                        -1,(_func_void_void_ptr *)0x0);
    break;
  case 3:
    uVar2 = jsonSkipLabel((JsonEachCursor *)cur);
    if ((*(byte *)((long)&(_j[0x18].pVtab)->pModule + (ulong)uVar2) & 0xf) < 0xb) {
      jsonReturnFromBlob((JsonParse *)(_j + 0x18),uVar2,psStack_18,1);
    }
    break;
  case 4:
    sqlite3_result_int64(ctx,(ulong)*(uint *)((long)&cur[1].pVtab + 4));
    break;
  case 5:
    if ((*(int *)((long)&cur[3].pVtab + 4) != 0) && (*(char *)((long)&cur[3].pVtab + 1) != '\0')) {
      sqlite3_result_int64
                (ctx,(ulong)*(uint *)&cur[5].pVtab[*(int *)((long)&cur[3].pVtab + 4) - 1].pModule);
    }
    break;
  case 6:
    psVar1 = cur[10].pVtab;
    if (*(int *)((long)&cur[3].pVtab + 4) != 0) {
      jsonAppendPathName((JsonEachCursor *)cur);
    }
    sqlite3_result_text64
              (psStack_18,(char *)_j[8].pVtab,(sqlite3_uint64)_j[10].pVtab,
               (_func_void_void_ptr *)0xffffffffffffffff,'\x01');
    _j[10].pVtab = psVar1;
    break;
  case 7:
    uVar2 = jsonEachPathLength((JsonEachCursor *)cur);
    sqlite3_result_text64
              (psStack_18,(char *)_j[8].pVtab,(ulong)uVar2,(_func_void_void_ptr *)0xffffffffffffffff
               ,'\x01');
    break;
  case 8:
    if (cur[0x1a].pVtab == (sqlite3_vtab *)0x0) {
      sqlite3_result_blob(ctx,cur[0x18].pVtab,*(int *)&cur[0x19].pVtab,
                          (_func_void_void_ptr *)0xffffffffffffffff);
    }
    else {
      sqlite3_result_text(ctx,(char *)cur[0x1a].pVtab,-1,(_func_void_void_ptr *)0xffffffffffffffff);
    }
    break;
  default:
    sqlite3_result_text(ctx,(char *)cur[8].pVtab,*(int *)((long)&cur[2].pVtab + 4),
                        (_func_void_void_ptr *)0x0);
  }
  return 0;
}

Assistant:

static int jsonEachColumn(
  sqlite3_vtab_cursor *cur,   /* The cursor */
  sqlite3_context *ctx,       /* First argument to sqlite3_result_...() */
  int iColumn                 /* Which column to return */
){
  JsonEachCursor *p = (JsonEachCursor*)cur;
  switch( iColumn ){
    case JEACH_KEY: {
      if( p->nParent==0 ){
        u32 n, j;
        if( p->nRoot==1 ) break;
        j = jsonEachPathLength(p);
        n = p->nRoot - j;
        if( n==0 ){
          break;
        }else if( p->path.zBuf[j]=='[' ){
          i64 x;
          sqlite3Atoi64(&p->path.zBuf[j+1], &x, n-1, SQLITE_UTF8);
          sqlite3_result_int64(ctx, x);
        }else if( p->path.zBuf[j+1]=='"' ){
          sqlite3_result_text(ctx, &p->path.zBuf[j+2], n-3, SQLITE_TRANSIENT);
        }else{
          sqlite3_result_text(ctx, &p->path.zBuf[j+1], n-1, SQLITE_TRANSIENT);
        }
        break;
      }
      if( p->eType==JSONB_OBJECT ){
        jsonReturnFromBlob(&p->sParse, p->i, ctx, 1);
      }else{
        assert( p->eType==JSONB_ARRAY );
        sqlite3_result_int64(ctx, p->aParent[p->nParent-1].iKey);
      }
      break;
    }
    case JEACH_VALUE: {
      u32 i = jsonSkipLabel(p);
      jsonReturnFromBlob(&p->sParse, i, ctx, 1);
      if( (p->sParse.aBlob[i] & 0x0f)>=JSONB_ARRAY ){
        sqlite3_result_subtype(ctx, JSON_SUBTYPE);
      }
      break;
    }
    case JEACH_TYPE: {
      u32 i = jsonSkipLabel(p);
      u8 eType = p->sParse.aBlob[i] & 0x0f;
      sqlite3_result_text(ctx, jsonbType[eType], -1, SQLITE_STATIC);
      break;
    }
    case JEACH_ATOM: {
      u32 i = jsonSkipLabel(p);
      if( (p->sParse.aBlob[i] & 0x0f)<JSONB_ARRAY ){
        jsonReturnFromBlob(&p->sParse, i, ctx, 1);
      }
      break;
    }
    case JEACH_ID: {
      sqlite3_result_int64(ctx, (sqlite3_int64)p->i);
      break;
    }
    case JEACH_PARENT: {
      if( p->nParent>0 && p->bRecursive ){
        sqlite3_result_int64(ctx, p->aParent[p->nParent-1].iHead);
      }
      break;
    }
    case JEACH_FULLKEY: {
      u64 nBase = p->path.nUsed;
      if( p->nParent ) jsonAppendPathName(p);
      sqlite3_result_text64(ctx, p->path.zBuf, p->path.nUsed,
                            SQLITE_TRANSIENT, SQLITE_UTF8);
      p->path.nUsed = nBase;
      break;
    }
    case JEACH_PATH: {
      u32 n = jsonEachPathLength(p);
      sqlite3_result_text64(ctx, p->path.zBuf, n,
                            SQLITE_TRANSIENT, SQLITE_UTF8);
      break;
    }
    default: {
      sqlite3_result_text(ctx, p->path.zBuf, p->nRoot, SQLITE_STATIC);
      break;
    }
    case JEACH_JSON: {
      if( p->sParse.zJson==0 ){
        sqlite3_result_blob(ctx, p->sParse.aBlob, p->sParse.nBlob,
                            SQLITE_TRANSIENT);
      }else{
        sqlite3_result_text(ctx, p->sParse.zJson, -1, SQLITE_TRANSIENT);
      }
      break;
    }
  }
  return SQLITE_OK;
}